

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O0

void __thiscall bvh::v2::ThreadPool::ThreadPool(ThreadPool *this,size_t thread_count)

{
  size_t thread_count_local;
  ThreadPool *this_local;
  
  this->busy_count_ = 0;
  this->should_stop_ = false;
  std::mutex::mutex(&this->mutex_);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->threads_);
  std::condition_variable::condition_variable(&this->avail_);
  std::condition_variable::condition_variable(&this->done_);
  std::
  queue<std::function<void(unsigned_long)>,std::deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>>
  ::
  queue<std::deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>,void>
            ((queue<std::function<void(unsigned_long)>,std::deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>>
              *)&this->tasks_);
  start(this,thread_count);
  return;
}

Assistant:

ThreadPool(size_t thread_count = 0) { start(thread_count); }